

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_request.cpp
# Opt level: O0

int __thiscall HTTPRequest::parse_header_line(HTTPRequest *this,char *str,ssize_t size)

{
  long lVar1;
  ulong uVar2;
  ssize_t sVar3;
  long lVar4;
  mapped_type *this_00;
  allocator local_89;
  string local_88 [55];
  allocator local_51;
  string local_50 [32];
  ulong local_30;
  ssize_t i;
  ssize_t size_local;
  char *str_local;
  HTTPRequest *this_local;
  
  for (local_30 = 0;
      ((long)(local_30 + 1) < size && ((str[local_30] != ':' || (str[local_30 + 1] != ' '))));
      local_30 = local_30 + 1) {
  }
  if (local_30 + 1 == size) {
    this_local._4_4_ = -1;
  }
  else {
    lVar1 = local_30 + 2;
    lVar4 = size - local_30;
    i = size;
    size_local = (ssize_t)str;
    str_local = (char *)this;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_50,str + lVar1,lVar4 - 2,&local_51);
    sVar3 = size_local;
    uVar2 = local_30;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_88,(char *)sVar3,uVar2,&local_89);
    this_00 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](&this->header,(key_type *)local_88);
    std::__cxx11::string::operator=((string *)this_00,local_50);
    std::__cxx11::string::~string(local_88);
    std::allocator<char>::~allocator((allocator<char> *)&local_89);
    std::__cxx11::string::~string(local_50);
    std::allocator<char>::~allocator((allocator<char> *)&local_51);
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

int HTTPRequest::parse_header_line(const char *str, ssize_t size) {
    ssize_t i = size;
    for (i = 0; i + 1 < size; i++) {
        if (str[i] == ':' && str[i + 1] == ' ') {
            break;
        }
    }
    if (i + 1 == size) {
        return -1;
    } else {
        this->header[std::string(str, i * sizeof(char))] = std::string(str + i + 2, (size - i - 2) * sizeof(char));
        return 0;
    }
}